

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_config.c
# Opt level: O2

int mpt_parse_config(mpt_input_parser_t next,void *npar,mpt_parser_context *parse,
                    mpt_path_handler_t save,void *ctx)

{
  uint uVar1;
  int iVar2;
  mpt_value *pmVar3;
  iovec vec;
  mpt_path path;
  mpt_value val;
  
  path.len = 0;
  path.first = '\0';
  path.flags = '\0';
  path.sep = '.';
  path.assign = '\0';
  path._28_4_ = 0;
  path.base._0_4_ = 0;
  path.base._4_4_ = 0;
  path.off._0_4_ = 0;
  path.off._4_4_ = 0;
  val._addr = &vec;
  val._type = 0x43;
  do {
    uVar1 = (*next)(npar,parse,&path);
    if ((int)uVar1 < 1) {
LAB_001181d3:
      mpt_path_fini(&path);
      return uVar1;
    }
    vec.iov_base = (void *)(CONCAT44(path.base._4_4_,path.base._0_4_) +
                            CONCAT44(path.off._4_4_,(undefined4)path.off) + path.len);
    vec.iov_len = (size_t)parse->valid;
    if ((uVar1 & 4) == 0) {
      pmVar3 = (mpt_value *)0x0;
    }
    else {
      pmVar3 = &val;
    }
    iVar2 = (*save)(ctx,&path,pmVar3,(int)parse->prev,uVar1);
    if (iVar2 < 0) {
      uVar1 = 0xffffff80;
      goto LAB_001181d3;
    }
    if ((uVar1 & 2) == 0) {
      iVar2 = mpt_path_invalidate(&path);
    }
    else {
      iVar2 = mpt_path_del(&path);
    }
    if (iVar2 < 0) {
      uVar1 = 0xfffffff0;
      goto LAB_001181d3;
    }
    parse->prev = parse->curr;
    parse->curr = '\0';
    parse->valid = 0;
  } while( true );
}

Assistant:

extern int mpt_parse_config(MPT_TYPE(input_parser) next, void *npar, MPT_STRUCT(parser_context) *parse, MPT_TYPE(path_handler) save, void *ctx)
{
	MPT_STRUCT(path) path = MPT_PATH_INIT;
	struct iovec vec;
	MPT_STRUCT(value) val = MPT_VALUE_INIT(MPT_type_toVector('c'), &vec);
	int ret;
	
	/* accuire next path element */
	while ((ret = next(npar, parse, &path)) > 0) {
		vec.iov_base = (char *) (path.base + path.off + path.len);
		vec.iov_len  = parse->valid;
		
		/* save to configuration */
		if (save(ctx, &path, ret & MPT_PARSEFLAG(Data) ? &val : 0, parse->prev, ret) < 0) {
			ret = -0x80;
			break;
		}
		/* remove last path element or trailing data */
		if (ret & MPT_PARSEFLAG(SectEnd)) {
			ret = mpt_path_del(&path);
		} else {
			ret = mpt_path_invalidate(&path);
		}
		if (ret < 0) {
			ret = MPT_ERROR(MissingData);
			break;
		}
		/* cycle parse state */
		parse->prev = parse->curr;
		parse->curr = 0;
		
		/* reset valid post path size */
		parse->valid = 0;
	}
	mpt_path_fini(&path);
	
	return ret;
}